

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

bool __thiscall QToolBarAreaLayout::toolBarBreak(QToolBarAreaLayout *this,QToolBar *toolBar)

{
  QToolBarAreaLayoutLine *pQVar1;
  QToolBar *pQVar2;
  ulong uVar3;
  byte bVar4;
  long in_RCX;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = 0;
  do {
    bVar4 = (byte)in_RCX;
    if (uVar3 == 4) {
LAB_0046fd85:
      return (bool)(uVar3 < 4 & bVar4);
    }
    for (uVar6 = 0; uVar6 < (ulong)this->docks[uVar3].lines.d.size; uVar6 = uVar6 + 1) {
      pQVar1 = this->docks[uVar3].lines.d.ptr;
      in_RCX = uVar6 * 0x30;
      lVar5 = 0;
      for (uVar7 = 0; uVar7 < (ulong)pQVar1[uVar6].toolBarItems.d.size; uVar7 = uVar7 + 1) {
        pQVar2 = (QToolBar *)
                 (**(code **)(**(long **)((long)&(pQVar1[uVar6].toolBarItems.d.ptr)->widgetItem +
                                         lVar5) + 0x68))();
        if (pQVar2 == toolBar) {
          bVar4 = lVar5 == 0 && uVar6 != 0;
          goto LAB_0046fd85;
        }
        lVar5 = lVar5 + 0x18;
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

bool QToolBarAreaLayout::toolBarBreak(QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar)
                    return j > 0 && k == 0;
            }
        }
    }

    return false;
}